

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barrier.cpp
# Opt level: O3

void __thiscall embree::BarrierSys::BarrierSys(BarrierSys *this,size_t N)

{
  MutexSys *this_00;
  
  this_00 = (MutexSys *)operator_new(0x20);
  MutexSys::MutexSys(this_00);
  ConditionSys::ConditionSys((ConditionSys *)(this_00 + 1));
  this_00[2].mutex = (void *)0x0;
  this_00[3].mutex = (void *)0x0;
  this_00[2].mutex = (void *)0x0;
  this_00[3].mutex = (void *)N;
  this->opaque = this_00;
  return;
}

Assistant:

BarrierSys::BarrierSys (size_t N) {
    opaque = new BarrierSysImplementation(N);
  }